

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::_InternalSerialize
          (CustomModel_CustomModelParamValue *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  void *data;
  bool bVar1;
  uint8_t uVar2;
  undefined8 *puVar3;
  uint8_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  string *s;
  ValueUnion VVar8;
  ulong uVar9;
  size_t __n;
  
  if (this->_oneof_case_[0] == 10) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (this->_oneof_case_[0] == 10) {
      VVar8 = this->value_;
    }
    else {
      VVar8.doublevalue_ = 0.0;
    }
    *target = 'Q';
    ((ValueUnion *)(target + 1))->doublevalue_ = (double)VVar8;
    target = target + 9;
  }
  if (this->_oneof_case_[0] == 0x14) {
    puVar3 = (undefined8 *)((this->value_).longvalue_ & 0xfffffffffffffffe);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar3,*(int *)(puVar3 + 1),SERIALIZE,
               "CoreML.Specification.CustomModel.CustomModelParamValue.stringValue");
    if (this->_oneof_case_[0] == 0x14) {
      s = (string *)((this->value_).longvalue_ & 0xfffffffffffffffe);
    }
    else {
      s = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x14,s,target);
  }
  if (this->_oneof_case_[0] == 0x1e) {
    puVar4 = target;
    if (stream->end_ <= target) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = 0;
    if (this->_oneof_case_[0] == 0x1e) {
      uVar7 = (this->value_).intvalue_;
    }
    puVar4[0] = 0xf0;
    puVar4[1] = '\x01';
    puVar4[2] = (byte)uVar7;
    if (uVar7 < 0x80) {
      target = puVar4 + 3;
    }
    else {
      puVar4[2] = (byte)uVar7 | 0x80;
      puVar4[3] = (uint8_t)((ulong)(long)(int)uVar7 >> 7);
      target = puVar4 + 4;
      if (0x3fff < uVar7) {
        uVar9 = (ulong)puVar4[3];
        uVar6 = (ulong)(long)(int)uVar7 >> 7;
        do {
          target[-1] = (byte)uVar9 | 0x80;
          uVar5 = uVar6 >> 7;
          *target = (uint8_t)uVar5;
          target = target + 1;
          uVar9 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
    }
  }
  puVar4 = target;
  if (this->_oneof_case_[0] == 0x28) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (this->_oneof_case_[0] == 0x28) {
      VVar8 = this->value_;
    }
    else {
      VVar8.doublevalue_ = 0.0;
    }
    target[0] = 0xc0;
    target[1] = '\x02';
    target[2] = VVar8.boolvalue_;
    if (VVar8 < 0x80) {
      puVar4 = target + 3;
    }
    else {
      target[2] = VVar8.boolvalue_ | 0x80;
      target[3] = (uint8_t)((ulong)VVar8.longvalue_ >> 7);
      puVar4 = target + 4;
      if (0x3fff < VVar8) {
        uVar9 = (ulong)target[3];
        uVar6 = (ulong)VVar8.longvalue_ >> 7;
        do {
          puVar4[-1] = (byte)uVar9 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar4 = (uint8_t)uVar5;
          puVar4 = puVar4 + 1;
          uVar9 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
    }
  }
  if (this->_oneof_case_[0] == 0x32) {
    if (stream->end_ <= puVar4) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
    }
    uVar2 = '\0';
    if (this->_oneof_case_[0] == 0x32) {
      uVar2 = (uint8_t)(this->value_).intvalue_;
    }
    puVar4[0] = 0x90;
    puVar4[1] = '\x03';
    puVar4[2] = uVar2;
    puVar4 = puVar4 + 3;
  }
  if (this->_oneof_case_[0] == 0x3c) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x3c,(string *)((this->value_).longvalue_ & 0xfffffffffffffffe),
                        puVar4);
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    data = *(void **)((uVar6 & 0xfffffffffffffffc) + 8);
    uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar6 & 1) == 0) {
      puVar3 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar3 = (undefined8 *)((uVar6 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar3[1];
    if ((long)stream->end_ - (long)puVar4 < (long)__n) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar3[1],puVar4);
      return puVar4;
    }
    memcpy(puVar4,data,__n);
    puVar4 = puVar4 + __n;
  }
  return puVar4;
}

Assistant:

uint8_t* CustomModel_CustomModelParamValue::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.CustomModel.CustomModelParamValue)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // double doubleValue = 10;
  if (_internal_has_doublevalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(10, this->_internal_doublevalue(), target);
  }

  // string stringValue = 20;
  if (_internal_has_stringvalue()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_stringvalue().data(), static_cast<int>(this->_internal_stringvalue().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CustomModel.CustomModelParamValue.stringValue");
    target = stream->WriteStringMaybeAliased(
        20, this->_internal_stringvalue(), target);
  }

  // int32 intValue = 30;
  if (_internal_has_intvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(30, this->_internal_intvalue(), target);
  }

  // int64 longValue = 40;
  if (_internal_has_longvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(40, this->_internal_longvalue(), target);
  }

  // bool boolValue = 50;
  if (_internal_has_boolvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(50, this->_internal_boolvalue(), target);
  }

  // bytes bytesValue = 60;
  if (_internal_has_bytesvalue()) {
    target = stream->WriteBytesMaybeAliased(
        60, this->_internal_bytesvalue(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.CustomModel.CustomModelParamValue)
  return target;
}